

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O3

gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_> * __thiscall
mjs::gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>,_true>::
dereference(gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>,_true>
            *this,gc_heap *h)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = gc_heap::type_check<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,false>>>
                    (h,this->pos_);
  if (!bVar2) {
    __assert_fail("h.type_check<T>(pos_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                  0x1db,
                  "T &mjs::gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object, false>>>::dereference(gc_heap &) const [T = mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object, false>>, strong = true]"
                 );
  }
  uVar1 = this->pos_;
  if (((h->alloc_context_).start_ <= uVar1) && (uVar1 < (h->alloc_context_).next_free_)) {
    return (gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_> *)
           ((h->alloc_context_).storage_ + uVar1);
  }
  __assert_fail("pos_inside(pos)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x13a,"slot *mjs::gc_heap::allocation_context::get_at(uint32_t) const");
}

Assistant:

T& dereference(gc_heap& h) const {
        assert(h.type_check<T>(pos_));
        return *reinterpret_cast<T*>(h.get_at(pos_));
    }